

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QSynth.cpp
# Opt level: O2

void QReportHandler::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int _t1;
  undefined4 *puVar1;
  code *pcVar2;
  long lVar3;
  long *plVar4;
  QArrayDataPointer<char16_t> local_38;
  QArrayDataPointer<char16_t> local_20;
  
  if (_c == IndexOfMethod) {
    puVar1 = (undefined4 *)*_a;
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == balloonMessageAppeared && lVar3 == 0) {
      *puVar1 = 0;
    }
    else if (pcVar2 == masterVolumeChanged && lVar3 == 0) {
      *puVar1 = 1;
    }
    else if (pcVar2 == reverbModeChanged && lVar3 == 0) {
      *puVar1 = 2;
    }
    else if (pcVar2 == reverbTimeChanged && lVar3 == 0) {
      *puVar1 = 3;
    }
    else if (pcVar2 == reverbLevelChanged && lVar3 == 0) {
      *puVar1 = 4;
    }
    else if (pcVar2 == polyStateChanged && lVar3 == 0) {
      *puVar1 = 5;
    }
    else if (pcVar2 == programChanged && lVar3 == 0) {
      *puVar1 = 6;
    }
    else if (pcVar2 == lcdStateChanged && lVar3 == 0) {
      *puVar1 = 7;
    }
    else if (pcVar2 == midiMessageLEDStateChanged && lVar3 == 0) {
      *puVar1 = 8;
    }
  }
  else if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      balloonMessageAppeared((QReportHandler *)_o,(QString *)_a[1],(QString *)_a[2]);
      return;
    case 1:
      masterVolumeChanged((QReportHandler *)_o,*_a[1]);
      return;
    case 2:
      reverbModeChanged((QReportHandler *)_o,*_a[1]);
      return;
    case 3:
      reverbTimeChanged((QReportHandler *)_o,*_a[1]);
      return;
    case 4:
      reverbLevelChanged((QReportHandler *)_o,*_a[1]);
      return;
    case 5:
      polyStateChanged((QReportHandler *)_o,*_a[1]);
      return;
    case 6:
      plVar4 = (long *)_a[2];
      _t1 = *_a[1];
      local_20.d = (Data *)*plVar4;
      local_20.ptr = (char16_t *)plVar4[1];
      local_20.size = plVar4[2];
      if (local_20.d != (Data *)0x0) {
        LOCK();
        ((local_20.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_20.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      plVar4 = (long *)_a[3];
      local_38.d = (Data *)*plVar4;
      local_38.ptr = (char16_t *)plVar4[1];
      local_38.size = plVar4[2];
      if (local_38.d != (Data *)0x0) {
        LOCK();
        ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      programChanged((QReportHandler *)_o,_t1,(QString *)&local_20,(QString *)&local_38);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_20);
      break;
    case 7:
      lcdStateChanged((QReportHandler *)_o);
      return;
    case 8:
      midiMessageLEDStateChanged((QReportHandler *)_o,*_a[1]);
      return;
    }
  }
  return;
}

Assistant:

void QReportHandler::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<QReportHandler *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->balloonMessageAppeared((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 1: _t->masterVolumeChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->reverbModeChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->reverbTimeChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->reverbLevelChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: _t->polyStateChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 6: _t->programChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[3]))); break;
        case 7: _t->lcdStateChanged(); break;
        case 8: _t->midiMessageLEDStateChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (QReportHandler::*)(const QString & , const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QReportHandler::balloonMessageAppeared)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (QReportHandler::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QReportHandler::masterVolumeChanged)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (QReportHandler::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QReportHandler::reverbModeChanged)) {
                *result = 2;
                return;
            }
        }
        {
            using _t = void (QReportHandler::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QReportHandler::reverbTimeChanged)) {
                *result = 3;
                return;
            }
        }
        {
            using _t = void (QReportHandler::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QReportHandler::reverbLevelChanged)) {
                *result = 4;
                return;
            }
        }
        {
            using _t = void (QReportHandler::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QReportHandler::polyStateChanged)) {
                *result = 5;
                return;
            }
        }
        {
            using _t = void (QReportHandler::*)(int , QString , QString );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QReportHandler::programChanged)) {
                *result = 6;
                return;
            }
        }
        {
            using _t = void (QReportHandler::*)();
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QReportHandler::lcdStateChanged)) {
                *result = 7;
                return;
            }
        }
        {
            using _t = void (QReportHandler::*)(bool );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QReportHandler::midiMessageLEDStateChanged)) {
                *result = 8;
                return;
            }
        }
    }
}